

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O0

Am_Value __thiscall Am_Load_Save_Context::Load(Am_Load_Save_Context *this,istream *is)

{
  Map<int,_Wrapper_Holder,_std::less<int>_> *this_00;
  Name_Num *pNVar1;
  bool bVar2;
  byte bVar3;
  Am_ID_Tag AVar4;
  long *plVar5;
  ulong uVar6;
  Am_Wrapper *pAVar7;
  basic_istream<char,_std::char_traits<char>_> *pbVar8;
  istream *in_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_01;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_02;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_03;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_04;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_05;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_06;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_07;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_08;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_09;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_10;
  anon_union_8_8_ea4c8939_for_value aVar9;
  Am_Value AVar10;
  Name_Num local_188;
  undefined1 local_178 [24];
  undefined1 local_160 [20];
  int base;
  Wrapper_Holder value_2;
  char name [100];
  undefined1 local_d8 [8];
  Wrapper_Holder value_1;
  Am_Load_Method_Type **local_b0;
  undefined1 local_a8 [8];
  Am_Load_Method method;
  char type_name [100];
  int local_28;
  char local_21;
  int number;
  char ch;
  istream *is_local;
  Am_Load_Save_Context *this_local;
  Am_Value *value;
  
  is_local = is;
  this_local = this;
  if (*(long *)is == 0) {
    Am_Error("Load called on a (0L) load/save context");
  }
  _number = in_RDX;
  std::operator>>(in_RDX,&local_21);
  switch(local_21) {
  case 'D':
    plVar5 = (long *)std::istream::operator>>(_number,&local_28);
    uVar6 = std::ios::operator!((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
    if ((uVar6 & 1) == 0) {
      *(int *)(*(long *)is + 0x40) = local_28;
      pbVar8 = std::operator>>(_number,(char *)&method.Call);
      uVar6 = std::ios::operator!((ios *)(pbVar8 + *(long *)(*(long *)pbVar8 + -0x18)));
      if ((uVar6 & 1) == 0) {
        local_b0 = &method.Call;
        _local_a8 = OpenAmulet::Map<const_char_*,_Am_Load_Method,_lex_less<const_char_*>_>::GetAt
                              (*(Map<const_char_*,_Am_Load_Method,_lex_less<const_char_*>_> **)
                                (*(long *)is + 0x10),(char **)&local_b0);
        bVar2 = Am_Load_Method::Valid((Am_Load_Method *)local_a8);
        if (bVar2) {
          (*(code *)method.from_wrapper)(this,_number,is);
          bVar2 = Am_Value::Valid((Am_Value *)this);
          aVar9 = extraout_RDX_02;
          if ((bVar2) &&
             (AVar4 = Am_Type_Class(*(Am_ID_Tag *)&this->data), aVar9 = extraout_RDX_03,
             AVar4 == 0x2000)) {
            this_00 = *(Map<int,_Wrapper_Holder,_std::less<int>_> **)(*(long *)is + 0x30);
            pAVar7 = Am_Value::operator_cast_to_Am_Wrapper_((Am_Value *)this);
            Wrapper_Holder::Wrapper_Holder(&value_1,pAVar7);
            OpenAmulet::Map<int,_Wrapper_Holder,_std::less<int>_>::SetAt(this_00,local_28,&value_1);
            Wrapper_Holder::~Wrapper_Holder(&value_1);
            aVar9 = extraout_RDX_04;
          }
        }
        else {
          Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
          aVar9 = extraout_RDX_01;
        }
      }
      else {
        Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
        aVar9 = extraout_RDX_00;
      }
    }
    else {
      Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
      aVar9 = extraout_RDX;
    }
    break;
  default:
    Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
    aVar9 = extraout_RDX_10;
    break;
  case 'N':
    pAVar7 = Wrapper_Holder::operator_cast_to_Am_Wrapper_(&No_Wrapper);
    Am_Value::Am_Value((Am_Value *)this,pAVar7);
    aVar9 = extraout_RDX_07;
    break;
  case 'P':
    pbVar8 = std::operator>>(_number,(char *)&value_2);
    uVar6 = std::ios::operator!((ios *)(pbVar8 + *(long *)(*(long *)pbVar8 + -0x18)));
    if ((uVar6 & 1) != 0) {
      Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
      aVar9 = extraout_RDX_08;
      break;
    }
    std::istream::get((char *)_number);
    Wrapper_Holder::Wrapper_Holder((Wrapper_Holder *)(local_160 + 0x10));
    if (local_21 == ' ') {
      plVar5 = (long *)std::istream::operator>>(_number,(int *)(local_160 + 0xc));
      bVar3 = std::ios::operator!((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
      if ((bVar3 & 1) == 0) {
        pNVar1 = *(Name_Num **)(*(long *)is + 0x20);
        Name_Num::Name_Num((Name_Num *)(local_178 + 8),(char *)&value_2,local_160._12_4_);
        OpenAmulet::Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_>::GetAt
                  ((Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_> *)local_160,pNVar1);
        Wrapper_Holder::operator=((Wrapper_Holder *)(local_160 + 0x10),(Wrapper_Holder *)local_160);
        Wrapper_Holder::~Wrapper_Holder((Wrapper_Holder *)local_160);
        goto LAB_002e9e0a;
      }
      Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
    }
    else {
      pNVar1 = *(Name_Num **)(*(long *)is + 0x20);
      Name_Num::Name_Num(&local_188,(char *)&value_2);
      OpenAmulet::Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_>::GetAt
                ((Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_> *)local_178,pNVar1);
      Wrapper_Holder::operator=((Wrapper_Holder *)(local_160 + 0x10),(Wrapper_Holder *)local_178);
      Wrapper_Holder::~Wrapper_Holder((Wrapper_Holder *)local_178);
LAB_002e9e0a:
      bVar2 = Wrapper_Holder::Valid((Wrapper_Holder *)(local_160 + 0x10));
      if (bVar2) {
        pAVar7 = Wrapper_Holder::operator_cast_to_Am_Wrapper_((Wrapper_Holder *)(local_160 + 0x10));
        Am_Value::Am_Value((Am_Value *)this,pAVar7);
      }
      else {
        Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
      }
    }
    Wrapper_Holder::~Wrapper_Holder((Wrapper_Holder *)(local_160 + 0x10));
    aVar9 = extraout_RDX_09;
    break;
  case 'R':
    plVar5 = (long *)std::istream::operator>>(_number,(int *)(*(long *)is + 0x40));
    uVar6 = std::ios::operator!((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
    if ((uVar6 & 1) == 0) {
      OpenAmulet::Map<int,_Wrapper_Holder,_std::less<int>_>::GetAt
                ((Map<int,_Wrapper_Holder,_std::less<int>_> *)local_d8,*(int **)(*(long *)is + 0x30)
                );
      bVar2 = Wrapper_Holder::Valid((Wrapper_Holder *)local_d8);
      if (bVar2) {
        pAVar7 = Wrapper_Holder::operator_cast_to_Am_Wrapper_((Wrapper_Holder *)local_d8);
        Am_Value::Am_Value((Am_Value *)this,pAVar7);
      }
      else {
        Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
      }
      Wrapper_Holder::~Wrapper_Holder((Wrapper_Holder *)local_d8);
      aVar9 = extraout_RDX_06;
    }
    else {
      Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
      aVar9 = extraout_RDX_05;
    }
  }
  AVar10.value.wrapper_value = aVar9.wrapper_value;
  AVar10._0_8_ = this;
  return AVar10;
}

Assistant:

Am_Value
Am_Load_Save_Context::Load(std::istream &is)
{
  if (!data) {
    Am_Error("Load called on a (0L) load/save context");
  }

  // operator >> will skip whitespace
  char ch;
  is >> ch;

  // check what type we have
  switch (ch) {
  case 'D': {
    // read in the number
    int number;
    if (!(is >> number)) {
      // ups, there is none...
      return Am_No_Value;
    }
    data->counter = number;

    // read in the type name
    char type_name[100]; // TODO: Remove that 100 chars arbitrary limit
    if (!(is >> type_name)) {
      return Am_No_Value;
    }

    // get the loader-method for the given type-name by asking the
    // map which stores the type-name/loader-method pairs
    Am_Load_Method method = data->loader->GetAt(type_name);

    // did we received a valid method-pointer?
    if (method.Valid() == false) {
      // no
      return Am_No_Value;
    }

    // yes, than read the value
    Am_Value value = method.Call(is, *this);

    // check to see if all types are the same
    if (value.Valid() && Am_Type_Class(value.type) == Am_WRAPPER) {
      data->wrappers->SetAt(number, Wrapper_Holder(value));
    }

    // and return the found value
    return (value);
  }

  case 'R': {
    if (!(is >> data->counter))
      return Am_No_Value;
    // is.get (ch); // skip eoln
    // if (ch != '\n') return Am_No_Value;
    Wrapper_Holder value = data->wrappers->GetAt(data->counter);
    if (!value.Valid())
      return Am_No_Value;
    return Am_Value(value);
  }

  case 'N': {
    // is.get (ch); // skip eoln
    // if (ch != '\n') return Am_No_Value;
    return Am_Value(No_Wrapper);
  }

  case 'P': {
    char name[100]; // TODO: Remove that 100 chars arbitrary limit
    if (!(is >> name))
      return Am_No_Value;
    is.get(ch); // will be space or (part of) EOLN
    Wrapper_Holder value;
    if (ch == ' ') {
      int base;
      if (!(is >> base))
        return Am_No_Value;
      value = data->prototypes->GetAt(Name_Num(name, base));
      // is.get (ch); // skip eoln
      // if (ch != '\n') return Am_No_Value;
    } else
      value = data->prototypes->GetAt(Name_Num(name));
    if (!value.Valid())
      return Am_No_Value;
    return Am_Value(value);
  }

  default: {
    // no known type found...
    return (Am_No_Value);
  }
  }
}